

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car.cpp
# Opt level: O1

void __thiscall Car::move(Car *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  timespec local_38;
  
  if (this->_active == true) {
    do {
      uVar4 = (ulong)this->_delay;
      if (0 < (long)uVar4) {
        local_38.tv_sec = uVar4 / 1000;
        local_38.tv_nsec = (uVar4 % 1000) * 1000000;
        do {
          iVar1 = nanosleep(&local_38,&local_38);
          if (iVar1 != -1) break;
          piVar3 = __errno_location();
        } while (*piVar3 == 4);
      }
      iVar1 = std::__cxx11::string::compare((char *)&this->_axis);
      if (iVar1 == 0) {
        iVar2 = get_xpos(this);
        iVar2 = iVar2 + this->_speed;
        iVar1 = 0;
        if (0 < iVar2) {
          iVar1 = iVar2;
        }
        if (this->_limit < iVar2) {
          iVar1 = this->_limit + -5;
        }
        set_xpos(this,iVar1);
      }
      else {
        iVar2 = get_ypos(this);
        iVar2 = iVar2 + this->_speed;
        iVar1 = 0;
        if (0 < iVar2) {
          iVar1 = iVar2;
        }
        if (this->_limit < iVar2) {
          iVar1 = this->_limit + -5;
        }
        set_ypos(this,iVar1);
      }
      iVar1 = get_xpos(this);
      if (iVar1 < 0xf) {
        iVar1 = get_ypos(this);
        if (iVar1 < 0xf) {
          this->_active = false;
          this->_succeeded = true;
        }
      }
    } while (this->_active != false);
  }
  iVar1 = get_xpos(this);
  if (iVar1 < 0xf) {
    iVar1 = get_ypos(this);
    if (iVar1 < 0xf) {
      this->_succeeded = true;
    }
  }
  return;
}

Assistant:

void Car::move(){
        // horizontal
        // vertical
        while(_active){
            std::this_thread::sleep_for(std::chrono::milliseconds(_delay));
            if (_axis == "horizontal"){
                int x = get_xpos();
                set_xpos( newPos(x));

                //std::cout << "Car Thread #: " <<std::this_thread::get_id()<<" ---    Pos ="<< _xpos<<std::endl;
            }else{
                int y = get_ypos();
                set_ypos(newPos(y));

                //std::cout << "Car Thread #: " <<std::this_thread::get_id()<<" ---   Pos = " <<_ypos<<std::endl;
            }
            // reached to  the correct place
            if(get_xpos()< 15 && get_ypos() <15)
                {   
                    _active = false;
                    _succeeded = true;
                }
        }
            // stopped in the correct place
              if(get_xpos()< 15 && get_ypos() <15)
                {
                    _succeeded = true;
                }

                //std::cout  << std::this_thread::get_id()<< " thread is ending\n"<< std::endl;
    }